

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skein.c
# Opt level: O3

int Skein_256_Init(Skein_256_Ctxt_t *ctx,size_t hashBitLen)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  u08b_t local_28 [8];
  size_t local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  (ctx->h).hashBitLen = hashBitLen;
  switch(hashBitLen << 0x3b | hashBitLen - 0x80 >> 5) {
  case 0:
    ctx->X[2] = 0x10080df491960f7a;
    ctx->X[3] = 0xccf7dde5b45bc1c2;
    uVar1 = 0x964d7260;
    uVar2 = 0xe1111906;
    uVar3 = 0x7c8d811c;
    uVar4 = 0x883daaa7;
    break;
  case 1:
    ctx->X[2] = 0xd47a58568838d63e;
    ctx->X[3] = 0x2dd2e4968586ab7d;
    uVar1 = 0x72825e98;
    uVar2 = 0x14202314;
    uVar3 = 0x5a77e590;
    uVar4 = 0x2ac4e9a2;
    break;
  default:
    (ctx->h).T[1] = 0xc400000000000000;
    (ctx->h).bCnt = 0;
    (ctx->h).T[0] = 0;
    builtin_memcpy(local_28,"SHA3\x01",6);
    local_28[6] = '\0';
    local_28[7] = '\0';
    local_18 = 0;
    uStack_10 = 0;
    ctx->X[2] = 0;
    ctx->X[3] = 0;
    ctx->X[0] = 0;
    ctx->X[1] = 0;
    local_20 = hashBitLen;
    Skein_256_Process_Block(ctx,local_28,1,0x20);
    goto LAB_00107443;
  case 3:
    ctx->X[2] = 0x99cb88d7d7f53884;
    ctx->X[3] = 0x384bddb1aeddb5de;
    uVar1 = 0x9ae5ea0b;
    uVar2 = 0xc6098a8c;
    uVar3 = 0x8c5191c;
    uVar4 = 0x876d5686;
    break;
  case 4:
    ctx->X[2] = 0xb33bc3896656840f;
    ctx->X[3] = 0x6a54e920fde8da69;
    uVar1 = 0xd048b449;
    uVar2 = 0xfc9da860;
    uVar3 = 0x9fa7d833;
    uVar4 = 0x2fca6647;
  }
  *(undefined4 *)ctx->X = uVar1;
  *(undefined4 *)((long)ctx->X + 4) = uVar2;
  *(undefined4 *)(ctx->X + 1) = uVar3;
  *(undefined4 *)((long)ctx->X + 0xc) = uVar4;
LAB_00107443:
  (ctx->h).T[1] = 0x7000000000000000;
  (ctx->h).bCnt = 0;
  (ctx->h).T[0] = 0;
  return 0;
}

Assistant:

int Skein_256_Init(Skein_256_Ctxt_t *ctx, size_t hashBitLen)
{
    union
    {
        u08b_t  b[SKEIN_256_STATE_BYTES];
        u64b_t  w[SKEIN_256_STATE_WORDS];
    } cfg;                              /* config block */

    Skein_Assert(hashBitLen > 0,SKEIN_BAD_HASHLEN);
    ctx->h.hashBitLen = hashBitLen;         /* output hash bit count */

    switch (hashBitLen)
    {             /* use pre-computed values, where available */
    case  256:
        memcpy(ctx->X,SKEIN_256_IV_256,sizeof(ctx->X));
        break;
    case  224:
        memcpy(ctx->X,SKEIN_256_IV_224,sizeof(ctx->X));
        break;
    case  160:
        memcpy(ctx->X,SKEIN_256_IV_160,sizeof(ctx->X));
        break;
    case  128:
        memcpy(ctx->X,SKEIN_256_IV_128,sizeof(ctx->X));
        break;
    default:
        /* here if there is no precomputed IV value available */
        /* build/process the config block, type == CONFIG (could be precomputed) */
        Skein_Start_New_Type(ctx,CFG_FINAL);        /* set tweaks: T0=0; T1=CFG | FINAL */

        cfg.w[0] = Skein_Swap64(SKEIN_SCHEMA_VER);  /* set the schema, version */
        cfg.w[1] = Skein_Swap64(hashBitLen);        /* hash result length in bits */
        cfg.w[2] = Skein_Swap64(SKEIN_CFG_TREE_INFO_SEQUENTIAL);
        memset(&cfg.w[3],0,sizeof(cfg) - 3*sizeof(cfg.w[0])); /* zero pad config block */

        /* compute the initial chaining values from config block */
        memset(ctx->X,0,sizeof(ctx->X));            /* zero the chaining variables */
        Skein_256_Process_Block(ctx,cfg.b,1,SKEIN_CFG_STR_LEN);
        break;
    }
    /* The chaining vars ctx->X are now initialized for the given hashBitLen. */
    /* Set up to process the data message portion of the hash (default) */
    Skein_Start_New_Type(ctx,MSG);              /* T0=0, T1= MSG type */

    return SKEIN_SUCCESS;
}